

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testValidateQuoteRequest(int count)

{
  long lVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  allocator<char> local_60d;
  int local_60c;
  STRING local_608;
  NoRelatedSym noRelatedSym;
  DataDictionary dataDictionary;
  QuoteRequest message;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noRelatedSym,"1",(allocator<char> *)&local_608);
  FIX::QuoteReqID::QuoteReqID((QuoteReqID *)&dataDictionary,(STRING *)&noRelatedSym);
  FIX42::QuoteRequest::QuoteRequest(&message,(QuoteReqID *)&dataDictionary);
  local_60c = count;
  FIX::FieldBase::~FieldBase((FieldBase *)&dataDictionary);
  std::__cxx11::string::~string((string *)&noRelatedSym);
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym(&noRelatedSym);
  iVar3 = 10;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"IBM",&local_60d);
    FIX::Symbol::Symbol((Symbol *)&dataDictionary,&local_608);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(Symbol *)&dataDictionary);
    FIX::FieldBase::~FieldBase((FieldBase *)&dataDictionary);
    std::__cxx11::string::~string((string *)&local_608);
    FIX::MaturityMonthYear::MaturityMonthYear((MaturityMonthYear *)&dataDictionary);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(MaturityMonthYear *)&dataDictionary);
    FIX::FieldBase::~FieldBase((FieldBase *)&dataDictionary);
    FIX::PutOrCall::PutOrCall((PutOrCall *)&dataDictionary,&FIX::PutOrCall_PUT);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(PutOrCall *)&dataDictionary);
    FIX::FieldBase::~FieldBase((FieldBase *)&dataDictionary);
    local_608._M_dataplus._M_p = (pointer)0x405e000000000000;
    FIX::StrikePrice::StrikePrice((StrikePrice *)&dataDictionary,(PRICE *)&local_608);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(StrikePrice *)&dataDictionary);
    FIX::FieldBase::~FieldBase((FieldBase *)&dataDictionary);
    FIX::Side::Side((Side *)&dataDictionary,"11");
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(Side *)&dataDictionary);
    FIX::FieldBase::~FieldBase((FieldBase *)&dataDictionary);
    local_608._M_dataplus._M_p = (pointer)0x4059000000000000;
    FIX::OrderQty::OrderQty((OrderQty *)&dataDictionary,(QTY *)&local_608);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(OrderQty *)&dataDictionary);
    FIX::FieldBase::~FieldBase((FieldBase *)&dataDictionary);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"USD",&local_60d);
    FIX::Currency::Currency((Currency *)&dataDictionary,&local_608);
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(Currency *)&dataDictionary);
    FIX::FieldBase::~FieldBase((FieldBase *)&dataDictionary);
    std::__cxx11::string::~string((string *)&local_608);
    FIX::OrdType::OrdType((OrdType *)&dataDictionary,"1");
    FIX42::QuoteRequest::NoRelatedSym::set
              ((NoRelatedSym *)&noRelatedSym.super_Group,(OrdType *)&dataDictionary);
    FIX::FieldBase::~FieldBase((FieldBase *)&dataDictionary);
    FIX::Message::addGroup((Message *)&message,&noRelatedSym.super_Group);
  }
  FIX::DataDictionary::DataDictionary(&dataDictionary);
  lVar1 = GetTickCount();
  iVar3 = 0;
  if (0 < local_60c) {
    iVar3 = local_60c;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    FIX::DataDictionary::validate(&dataDictionary,(Message *)&message);
  }
  lVar2 = GetTickCount();
  FIX::DataDictionary::~DataDictionary(&dataDictionary);
  FIX::FieldMap::~FieldMap((FieldMap *)&noRelatedSym);
  FIX::Message::~Message((Message *)&message);
  return lVar2 - lVar1;
}

Assistant:

long testValidateQuoteRequest( int count )
{
  FIX42::QuoteRequest message( FIX::QuoteReqID("1") );
  FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

  for( int i = 1; i <= 10; ++i )
  {
    noRelatedSym.set( FIX::Symbol("IBM") );
    noRelatedSym.set( FIX::MaturityMonthYear() );
    noRelatedSym.set( FIX::PutOrCall(FIX::PutOrCall_PUT) );
    noRelatedSym.set( FIX::StrikePrice(120) );
    noRelatedSym.set( FIX::Side(FIX::Side_BUY) );
    noRelatedSym.set( FIX::OrderQty(100) );
    noRelatedSym.set( FIX::Currency("USD") );
    noRelatedSym.set( FIX::OrdType(FIX::OrdType_MARKET) );
    message.addGroup( noRelatedSym );
  }

  FIX::DataDictionary dataDictionary;
  count = count - 1;

  long start = GetTickCount();
  for ( int j = 0; j <= count; ++j )
  {
    dataDictionary.validate( message );
  }
  return GetTickCount() - start;
}